

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O2

void __thiscall YM3812::YM3812(YM3812 *this,bool stereo)

{
  ulong uVar1;
  UINT32 *pUVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPLEmul_006e92f0;
  if (init_tables()::did_init == '\0') {
    piVar7 = tl_tab;
    lVar8 = 0;
    while (lVar8 != 0x100) {
      dVar10 = exp2((double)(int)(lVar8 + 1) * -0.00390625);
      dVar10 = floor(dVar10 * 65536.0);
      uVar4 = ((int)dVar10 >> 4) + 1U & 0xfffffffe;
      tl_tab[lVar8 * 2] = uVar4;
      tl_tab[lVar8 * 2 + 1] = -uVar4;
      bVar3 = 1;
      for (lVar6 = 0x804; lVar6 != 0x6004; lVar6 = lVar6 + 0x800) {
        *(int *)((long)piVar7 + lVar6 + -4) = tl_tab[lVar8 * 2] >> (bVar3 & 0x1f);
        *(int *)((long)piVar7 + lVar6) = (0 >> (bVar3 & 0x1f)) - tl_tab[lVar8 * 2] >> (bVar3 & 0x1f)
        ;
        bVar3 = bVar3 + 1;
      }
      piVar7 = piVar7 + 2;
      lVar8 = lVar8 + 1;
    }
    iVar9 = 1;
    for (lVar8 = 0; lVar8 != 0x1000; lVar8 = lVar8 + 4) {
      dVar10 = sin((double)iVar9 * 0.0030679615757712823);
      dVar11 = log(*(double *)(&DAT_005abe00 + (ulong)(0.0 < dVar10) * 8) / dVar10);
      *(uint *)((long)sin_tab + lVar8) =
           (uint)(dVar10 < 0.0) | (int)(dVar11 * 738.6598609351493) + 1U & 0xfffffffe;
      iVar9 = iVar9 + 2;
    }
    for (uVar1 = 0; uVar1 != 0x400; uVar1 = uVar1 + 1) {
      uVar5 = 0x1800;
      uVar4 = 0x1800;
      if (uVar1 < 0x200) {
        uVar4 = sin_tab[uVar1];
      }
      sin_tab[uVar1 + 0x400] = uVar4;
      sin_tab[uVar1 + 0x800] = sin_tab[(uint)uVar1 & 0x1ff];
      if (((uint)uVar1 >> 8 & 1) == 0) {
        uVar5 = sin_tab[uVar1 & 0xff];
      }
      sin_tab[uVar1 + 0xc00] = uVar5;
    }
    init_tables()::did_init = '\x01';
  }
  memset(&this->Chip,0,0x17e0);
  pUVar2 = (this->Chip).fn_tab;
  for (lVar8 = 0; lVar8 != 0x10000; lVar8 = lVar8 + 0x40) {
    *pUVar2 = (UINT32)(long)((double)(int)lVar8 * 63.99987484467331);
    pUVar2 = pUVar2 + 1;
  }
  (this->Chip).lfo_am_inc = 0x3ffff;
  (this->Chip).lfo_pm_inc = 0x3fff;
  (this->Chip).eg_timer_add = 0xffff;
  (this->Chip).eg_timer_overflow = 0x10000;
  for (lVar8 = 0xd8; lVar8 != 0x870; lVar8 = lVar8 + 0xd8) {
    *(undefined8 *)((long)(this->Chip).P_CH[0].SLOT[0].op1_out + lVar8 + -0x30) = 0x3f3504f33f3504f3
    ;
  }
  (this->Chip).IsStereo = stereo;
  Reset(this);
  return;
}

Assistant:

YM3812(bool stereo)
	{
		init_tables();

		/* clear */
		memset(&Chip, 0, sizeof(Chip));

		/* init global tables */
		OPL_initalize(&Chip);

		Chip.IsStereo = stereo;

		Reset();
	}